

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

block_state deflate_fast(deflate_state *s,int flush)

{
  uint uVar1;
  byte bVar2;
  ushf uVar3;
  ushort uVar4;
  uInt uVar5;
  bool bVar6;
  Bytef *local_60;
  Bytef *local_50;
  uint local_3c;
  uch cc;
  ush dist;
  uch len;
  int bflush;
  IPos hash_head;
  int flush_local;
  deflate_state *s_local;
  
  _dist = 0;
  do {
    if (s->lookahead < 0x106) {
      fill_window(s);
      if ((s->lookahead < 0x106) && (flush == 0)) {
        return need_more;
      }
      if (s->lookahead == 0) {
        if (s->block_start < 0) {
          local_60 = (Bytef *)0x0;
        }
        else {
          local_60 = s->window + (s->block_start & 0xffffffff);
        }
        cm_zlib__tr_flush_block
                  (s,(charf *)local_60,(ulong)s->strstart - s->block_start,(uint)(flush == 4));
        s->block_start = (ulong)s->strstart;
        flush_pending(s->strm);
        if (s->strm->avail_out == 0) {
          if (flush != 4) {
            return need_more;
          }
          return finish_started;
        }
        if (flush != 4) {
          return block_done;
        }
        return finish_done;
      }
    }
    if (2 < s->lookahead) {
      s->ins_h = (s->ins_h << ((byte)s->hash_shift & 0x1f) ^ (uint)s->window[s->strstart + 2]) &
                 s->hash_mask;
      uVar4 = s->head[s->ins_h];
      s->prev[s->strstart & s->w_mask] = uVar4;
      _dist = (uint)uVar4;
      s->head[s->ins_h] = (Posf)s->strstart;
    }
    if ((_dist != 0) && (s->strstart - _dist <= s->w_size - 0x106)) {
      if ((s->strategy == 2) || (s->strategy == 3)) {
        if ((s->strategy == 3) && (s->strstart - _dist == 1)) {
          uVar5 = longest_match_fast(s,_dist);
          s->match_length = uVar5;
        }
      }
      else {
        uVar5 = longest_match(s,_dist);
        s->match_length = uVar5;
      }
    }
    if (s->match_length < 3) {
      bVar2 = s->window[s->strstart];
      s->d_buf[s->last_lit] = 0;
      uVar1 = s->last_lit;
      s->last_lit = uVar1 + 1;
      s->l_buf[uVar1] = bVar2;
      s->dyn_ltree[bVar2].fc.freq = s->dyn_ltree[bVar2].fc.freq + 1;
      bVar6 = s->last_lit == s->lit_bufsize - 1;
      s->lookahead = s->lookahead - 1;
      s->strstart = s->strstart + 1;
    }
    else {
      bVar2 = (char)s->match_length - 3;
      uVar3 = (short)s->strstart - (short)s->match_start;
      s->d_buf[s->last_lit] = uVar3;
      uVar1 = s->last_lit;
      s->last_lit = uVar1 + 1;
      s->l_buf[uVar1] = bVar2;
      uVar4 = uVar3 - 1;
      s->dyn_ltree[(int)(""[bVar2] + 0x101)].fc.freq =
           s->dyn_ltree[(int)(""[bVar2] + 0x101)].fc.freq + 1;
      if (uVar4 < 0x100) {
        bVar2 = ""[uVar4];
      }
      else {
        bVar2 = ""[((int)(uint)uVar4 >> 7) + 0x100];
      }
      local_3c = (uint)bVar2;
      s->dyn_dtree[(int)local_3c].fc.freq = s->dyn_dtree[(int)local_3c].fc.freq + 1;
      bVar6 = s->last_lit == s->lit_bufsize - 1;
      s->lookahead = s->lookahead - s->match_length;
      if ((s->max_lazy_match < s->match_length) || (s->lookahead < 3)) {
        s->strstart = s->match_length + s->strstart;
        s->match_length = 0;
        s->ins_h = (uint)s->window[s->strstart];
        s->ins_h = (s->ins_h << ((byte)s->hash_shift & 0x1f) ^ (uint)s->window[s->strstart + 1]) &
                   s->hash_mask;
      }
      else {
        s->match_length = s->match_length - 1;
        do {
          s->strstart = s->strstart + 1;
          s->ins_h = (s->ins_h << ((byte)s->hash_shift & 0x1f) ^ (uint)s->window[s->strstart + 2]) &
                     s->hash_mask;
          uVar4 = s->head[s->ins_h];
          s->prev[s->strstart & s->w_mask] = uVar4;
          _dist = (uint)uVar4;
          s->head[s->ins_h] = (Posf)s->strstart;
          uVar5 = s->match_length - 1;
          s->match_length = uVar5;
        } while (uVar5 != 0);
        s->strstart = s->strstart + 1;
      }
    }
    if (bVar6) {
      if (s->block_start < 0) {
        local_50 = (Bytef *)0x0;
      }
      else {
        local_50 = s->window + (s->block_start & 0xffffffff);
      }
      cm_zlib__tr_flush_block(s,(charf *)local_50,(ulong)s->strstart - s->block_start,0);
      s->block_start = (ulong)s->strstart;
      flush_pending(s->strm);
      if (s->strm->avail_out == 0) {
        return need_more;
      }
    }
  } while( true );
}

Assistant:

local block_state deflate_fast(s, flush)
    deflate_state *s;
    int flush;
{
    IPos hash_head = NIL; /* head of the hash chain */
    int bflush;           /* set if current block must be flushed */

    for (;;) {
        /* Make sure that we always have enough lookahead, except
         * at the end of the input file. We need MAX_MATCH bytes
         * for the next match, plus MIN_MATCH bytes to insert the
         * string following the next match.
         */
        if (s->lookahead < MIN_LOOKAHEAD) {
            fill_window(s);
            if (s->lookahead < MIN_LOOKAHEAD && flush == Z_NO_FLUSH) {
                return need_more;
            }
            if (s->lookahead == 0) break; /* flush the current block */
        }

        /* Insert the string window[strstart .. strstart+2] in the
         * dictionary, and set hash_head to the head of the hash chain:
         */
        if (s->lookahead >= MIN_MATCH) {
            INSERT_STRING(s, s->strstart, hash_head);
        }

        /* Find the longest match, discarding those <= prev_length.
         * At this point we have always match_length < MIN_MATCH
         */
        if (hash_head != NIL && s->strstart - hash_head <= MAX_DIST(s)) {
            /* To simplify the code, we prevent matches with the string
             * of window index 0 (in particular we have to avoid a match
             * of the string with itself at the start of the input file).
             */
#ifdef FASTEST
            if ((s->strategy != Z_HUFFMAN_ONLY && s->strategy != Z_RLE) ||
                (s->strategy == Z_RLE && s->strstart - hash_head == 1)) {
                s->match_length = longest_match_fast (s, hash_head);
            }
#else
            if (s->strategy != Z_HUFFMAN_ONLY && s->strategy != Z_RLE) {
                s->match_length = longest_match (s, hash_head);
            } else if (s->strategy == Z_RLE && s->strstart - hash_head == 1) {
                s->match_length = longest_match_fast (s, hash_head);
            }
#endif
            /* longest_match() or longest_match_fast() sets match_start */
        }
        if (s->match_length >= MIN_MATCH) {
            check_match(s, s->strstart, s->match_start, s->match_length);

            _tr_tally_dist(s, s->strstart - s->match_start,
                           s->match_length - MIN_MATCH, bflush);

            s->lookahead -= s->match_length;

            /* Insert new strings in the hash table only if the match length
             * is not too large. This saves time but degrades compression.
             */
#ifndef FASTEST
            if (s->match_length <= s->max_insert_length &&
                s->lookahead >= MIN_MATCH) {
                s->match_length--; /* string at strstart already in table */
                do {
                    s->strstart++;
                    INSERT_STRING(s, s->strstart, hash_head);
                    /* strstart never exceeds WSIZE-MAX_MATCH, so there are
                     * always MIN_MATCH bytes ahead.
                     */
                } while (--s->match_length != 0);
                s->strstart++;
            } else
#endif
            {
                s->strstart += s->match_length;
                s->match_length = 0;
                s->ins_h = s->window[s->strstart];
                UPDATE_HASH(s, s->ins_h, s->window[s->strstart+1]);
#if MIN_MATCH != 3
                Call UPDATE_HASH() MIN_MATCH-3 more times
#endif
                /* If lookahead < MIN_MATCH, ins_h is garbage, but it does not
                 * matter since it will be recomputed at next deflate call.
                 */
            }
        } else {
            /* No match, output a literal byte */
            Tracevv((stderr,"%c", s->window[s->strstart]));
            _tr_tally_lit (s, s->window[s->strstart], bflush);
            s->lookahead--;
            s->strstart++;
        }
        if (bflush) FLUSH_BLOCK(s, 0);
    }
    FLUSH_BLOCK(s, flush == Z_FINISH);
    return flush == Z_FINISH ? finish_done : block_done;
}